

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

err_t rngCreate(read_i source,void *source_state)

{
  bool_t bVar1;
  int iVar2;
  err_t eVar3;
  size_t in_RSI;
  code *in_RDI;
  size_t pos;
  size_t count;
  size_t read;
  char *sources [4];
  _func_void_varargs *in_stack_ffffffffffffffa8;
  size_t *in_stack_ffffffffffffffb0;
  octet *hash;
  size_t *read_00;
  octet *in_stack_ffffffffffffffc0;
  char *key;
  char *state;
  char *state_00;
  err_t local_4;
  
  key = "trng";
  state = "trng2";
  state_00 = "timer";
  bVar1 = mtCallOnce(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((bVar1 == 0) || (_inited == 0)) {
    local_4 = 0xc9;
  }
  else {
    mtMtxLock((mt_mtx_t *)0x129298);
    if (_ctr == 0) {
      rngCreate_keep();
      _state = (rng_state_st *)blobCreate((size_t)in_stack_ffffffffffffffa8);
      if (_state == (rng_state_st *)0x0) {
        mtMtxUnlock((mt_mtx_t *)0x12933d);
        local_4 = 0x6e;
      }
      else {
        read_00 = (size_t *)0x0;
        beltHashStart(in_stack_ffffffffffffffb0);
        for (hash = (octet *)0x0; hash < (octet *)0x4; hash = hash + 1) {
          eVar3 = rngESRead(read_00,hash,(size_t)in_stack_ffffffffffffffa8,(char *)0x129394);
          if (eVar3 == 0) {
            beltHashStepH(in_stack_ffffffffffffffc0,(size_t)read_00,hash);
            read_00 = (size_t *)(in_stack_ffffffffffffffc0 + (long)read_00);
          }
        }
        if (in_RDI != (code *)0x0) {
          iVar2 = (*in_RDI)(&stack0xffffffffffffffc0,_state,0x20,in_RSI);
          if (iVar2 == 0) {
            beltHashStepH(in_stack_ffffffffffffffc0,(size_t)read_00,hash);
            read_00 = (size_t *)(in_stack_ffffffffffffffc0 + (long)read_00);
          }
        }
        if (read_00 < (size_t *)0x20) {
          blobClose((blob_t)0x12943f);
          _state = (rng_state_st *)0x0;
          mtMtxUnlock((mt_mtx_t *)0x129456);
          local_4 = 0x12f;
        }
        else {
          beltHashStepG(hash,in_stack_ffffffffffffffa8);
          beltHash_keep();
          memWipe(in_stack_ffffffffffffffc0,(size_t)read_00);
          brngCTRStart(state,(octet *)key,in_stack_ffffffffffffffc0);
          memWipe(in_stack_ffffffffffffffc0,(size_t)read_00);
          _ctr = 1;
          mtMtxUnlock((mt_mtx_t *)0x1294df);
          local_4 = 0;
        }
      }
    }
    else {
      if (in_RDI != (code *)0x0) {
        iVar2 = (*in_RDI)(&stack0xffffffffffffffc0,_state,0x20,in_RSI);
        if (iVar2 == 0) {
          brngCTRStepR(in_RDI,in_RSI,state_00);
        }
      }
      _ctr = _ctr + 1;
      mtMtxUnlock((mt_mtx_t *)0x129306);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

err_t rngCreate(read_i source, void* source_state)
{
	const char* sources[] = { "trng", "trng2", "sys", "timer" };
	size_t read, count, pos;
	// инициализировать однократно
	if (!mtCallOnce(&_once, rngInit) || !_inited)
		return ERR_FILE_CREATE;
	// заблокировать мьютекс
	mtMtxLock(_mtx);
	// состояние уже создано?
	if (_ctr)
	{
		// учесть дополнительный источник
		if (source && source(&read, _state->block, 32, source_state) == ERR_OK)
			brngCTRStepR(_state->block, 32, _state->alg_state);
		// увеличить счетчик обращений и завершить
		++_ctr;
		mtMtxUnlock(_mtx);
		return ERR_OK;
	}
	// создать состояние
	_state = (rng_state_st*)blobCreate(rngCreate_keep());
	if (!_state)
	{
		mtMtxUnlock(_mtx);
		return ERR_OUTOFMEMORY;
	}
	// опрос источников случайности
	count = 0;
	beltHashStart(_state->alg_state);
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
		if (rngESRead(&read, _state->block, 32, sources[pos]) == ERR_OK)
		{
			beltHashStepH(_state->block, read, _state->alg_state);
			count += read;
		}
	if (source && source(&read, _state->block, 32, source_state) == ERR_OK)
	{
		beltHashStepH(_state->block, read, _state->alg_state);
		count += read;
	}
	if (count < 32)
	{
		blobClose(_state), _state = 0;
		mtMtxUnlock(_mtx);
		return ERR_NOT_ENOUGH_ENTROPY;
	}
	// создать brngCTR
	beltHashStepG(_state->block, _state->alg_state);
	memWipe(_state->alg_state, beltHash_keep());
	brngCTRStart(_state->alg_state, _state->block, 0);
	memWipe(_state->block, 32);
	// завершить
	_ctr = 1;
	mtMtxUnlock(_mtx);
	return ERR_OK;
}